

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O0

BinInputStream * __thiscall xercesc_4_0::XMLURL::makeNewStream(XMLURL *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  MalformedURLException *pMVar5;
  BinFileInputStream *retStrm;
  XMLSize_t i;
  XMLCh local_56;
  uint value;
  undefined2 local_50;
  XMLCh value1_1 [4];
  XMLCh value1 [3];
  int percentIndex;
  BinFileInputStream *local_38;
  XMLSize_t end;
  ArrayJanitor<char16_t> basePathName;
  XMLCh *realPath;
  XMLURL *this_local;
  
  if ((this->fProtocol == File) &&
     ((this->fHost == (XMLCh *)0x0 ||
      (iVar2 = XMLString::compareIStringASCII(this->fHost,(XMLCh *)XMLUni::fgLocalHostString),
      iVar2 == 0)))) {
    basePathName.fMemoryManager =
         (MemoryManager *)XMLString::replicate(this->fPath,this->fMemoryManager);
    ArrayJanitor<char16_t>::ArrayJanitor
              ((ArrayJanitor<char16_t> *)&end,(char16_t *)basePathName.fMemoryManager,
               this->fMemoryManager);
    local_38 = (BinFileInputStream *)XMLString::stringLen((XMLCh *)basePathName.fMemoryManager);
    register0x00000000 =
         XMLString::indexOf((XMLCh *)basePathName.fMemoryManager,L'%',0,this->fMemoryManager);
    while (stack0xffffffffffffffb8 != -1) {
      if ((int)local_38 <= stack0xffffffffffffffb8 + 2) {
        value1_1[1] = L'\0';
        value1_1[2] = L'\0';
        XMLString::moveChars
                  (value1_1,(XMLCh *)((long)&(basePathName.fMemoryManager)->_vptr_MemoryManager +
                                     (long)stack0xffffffffffffffb8 * 2),
                   (ulong)(stack0xffffffffffffffb8 + 1 < (int)local_38) + 1);
        pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (pMVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                   ,0x271,XMLNUM_URI_Component_Invalid_EscapeSequence,
                   (XMLCh *)basePathName.fMemoryManager,value1_1,(XMLCh *)0x0,(XMLCh *)0x0,
                   this->fMemoryManager);
        __cxa_throw(pMVar5,&MalformedURLException::typeinfo,
                    MalformedURLException::~MalformedURLException);
      }
      bVar1 = isHexDigit(*(XMLCh *)((long)&(basePathName.fMemoryManager)->_vptr_MemoryManager +
                                   (long)stack0xffffffffffffffb8 * 2 + 2));
      if ((!bVar1) ||
         (bVar1 = isHexDigit(*(XMLCh *)((long)&(basePathName.fMemoryManager)->_vptr_MemoryManager +
                                       (long)stack0xffffffffffffffb8 * 2 + 4)), !bVar1)) {
        XMLString::moveChars
                  (&local_56,
                   (XMLCh *)((long)&(basePathName.fMemoryManager)->_vptr_MemoryManager +
                            (long)stack0xffffffffffffffb8 * 2),3);
        local_50 = 0;
        pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (pMVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                   ,0x27c,XMLNUM_URI_Component_Invalid_EscapeSequence,
                   (XMLCh *)basePathName.fMemoryManager,&local_56,(XMLCh *)0x0,(XMLCh *)0x0,
                   this->fMemoryManager);
        __cxa_throw(pMVar5,&MalformedURLException::typeinfo,
                    MalformedURLException::~MalformedURLException);
      }
      uVar3 = xlatHexDigit(*(XMLCh *)((long)&(basePathName.fMemoryManager)->_vptr_MemoryManager +
                                     (long)stack0xffffffffffffffb8 * 2 + 2));
      uVar4 = xlatHexDigit(*(XMLCh *)((long)&(basePathName.fMemoryManager)->_vptr_MemoryManager +
                                     (long)stack0xffffffffffffffb8 * 2 + 4));
      *(short *)((long)&(basePathName.fMemoryManager)->_vptr_MemoryManager +
                (long)stack0xffffffffffffffb8 * 2) = (short)uVar3 * 0x10 + (short)uVar4;
      for (retStrm = (BinFileInputStream *)(long)(stack0xffffffffffffffb8 + 1);
          retStrm < (BinFileInputStream *)((long)&local_38[-1].fMemoryManager + 6U);
          retStrm = (BinFileInputStream *)
                    ((long)&(retStrm->super_BinInputStream)._vptr_BinInputStream + 1)) {
        *(undefined2 *)
         ((long)&(basePathName.fMemoryManager)->_vptr_MemoryManager + (long)retStrm * 2) =
             *(undefined2 *)
              ((long)&(basePathName.fMemoryManager)->_vptr_MemoryManager + (long)retStrm * 2 + 4);
      }
      *(undefined2 *)((long)&(basePathName.fMemoryManager)->_vptr_MemoryManager + (long)retStrm * 2)
           = 0;
      local_38 = retStrm;
      if ((BinFileInputStream *)(long)(stack0xffffffffffffffb8 + 1) < retStrm) {
        register0x00000000 =
             XMLString::indexOf((XMLCh *)basePathName.fMemoryManager,L'%',
                                (long)(stack0xffffffffffffffb8 + 1),this->fMemoryManager);
      }
      else {
        stack0xffffffffffffffb8 = -1;
      }
    }
    this_local = (XMLURL *)XMemory::operator_new(0x18,this->fMemoryManager);
    BinFileInputStream::BinFileInputStream
              ((BinFileInputStream *)this_local,(XMLCh *)basePathName.fMemoryManager,
               this->fMemoryManager);
    bVar1 = BinFileInputStream::getIsOpen((BinFileInputStream *)this_local);
    if (!bVar1) {
      if (this_local != (XMLURL *)0x0) {
        (*((BinInputStream *)&this_local->_vptr_XMLURL)->_vptr_BinInputStream[1])();
      }
      this_local = (XMLURL *)0x0;
    }
    ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&end);
  }
  else {
    if (XMLPlatformUtils::fgNetAccessor == (long *)0x0) {
      pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (pMVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                 ,0x29f,URL_UnsupportedProto,this->fMemoryManager);
      __cxa_throw(pMVar5,&MalformedURLException::typeinfo,
                  MalformedURLException::~MalformedURLException);
    }
    this_local = (XMLURL *)
                 (**(code **)(*XMLPlatformUtils::fgNetAccessor + 0x18))
                           (XMLPlatformUtils::fgNetAccessor,this,0);
  }
  return (BinInputStream *)this_local;
}

Assistant:

BinInputStream* XMLURL::makeNewStream() const
{
    //
    //  If its a local host, then we short circuit it and use our own file
    //  stream support. Otherwise, we just let it fall through and let the
    //  installed network access object provide a stream.
    //
    if (fProtocol == XMLURL::File)
    {
        if (!fHost || !XMLString::compareIStringASCII(fHost, XMLUni::fgLocalHostString))
        {

            XMLCh* realPath = XMLString::replicate(fPath, fMemoryManager);
            ArrayJanitor<XMLCh> basePathName(realPath, fMemoryManager);

            //
            // Need to manually replace any character reference %xx first
            // HTTP protocol will be done automatically by the netaccessor
            //
            XMLSize_t end = XMLString::stringLen(realPath);
            int percentIndex = XMLString::indexOf(realPath, chPercent, 0, fMemoryManager);

            while (percentIndex != -1) {

            	// Isolate the length/boundary check so we don't try and copy off the end.
                if (percentIndex+2 >= (int)end)
                {
                    XMLCh value1[3];
                    value1[1] = chNull;
                    value1[2] = chNull;
					XMLString::moveChars(value1, &(realPath[percentIndex]), (percentIndex + 1 >= (int)end ? 1 : 2));
                    ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                            , realPath
                            , value1
                            , fMemoryManager);
                }
                else if (!isHexDigit(realPath[percentIndex+1]) || !isHexDigit(realPath[percentIndex+2]))
                {
                    XMLCh value1[4];
                    XMLString::moveChars(value1, &(realPath[percentIndex]), 3);
                    value1[3] = chNull;
                    ThrowXMLwithMemMgr2(MalformedURLException
                            , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                            , realPath
                            , value1
                            , fMemoryManager);
                }

                unsigned int value = (xlatHexDigit(realPath[percentIndex+1]) * 16) + xlatHexDigit(realPath[percentIndex+2]);

                realPath[percentIndex] = XMLCh(value);

                XMLSize_t i =0;
                for (i = percentIndex + 1; i < end - 2 ; i++)
                    realPath[i] = realPath[i+2];
                realPath[i] = chNull;
                end = i;

                if (((XMLSize_t)(percentIndex + 1)) < end)
                  percentIndex = XMLString::indexOf(realPath, chPercent, percentIndex + 1, fMemoryManager);
                else
                  percentIndex = -1;
            }


            BinFileInputStream* retStrm = new (fMemoryManager) BinFileInputStream(realPath, fMemoryManager);
            if (!retStrm->getIsOpen())
            {
                delete retStrm;
                return 0;
            }
            return retStrm;
        }
    }

    //
    //  If we don't have have an installed net accessor object, then we
    //  have to just throw here.
    //
    if (!XMLPlatformUtils::fgNetAccessor)
        ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_UnsupportedProto, fMemoryManager);

    // Else ask the net accessor to create the stream
    return XMLPlatformUtils::fgNetAccessor->makeNew(*this);
}